

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O1

bool __thiscall
Indexing::CodeTree::RemovingMatcher<false>::doAssignVar(RemovingMatcher<false> *this)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  
  sVar2 = (this->super_BaseMatcher).tp;
  uVar1 = (uint)((this->super_BaseMatcher).ft)->_data[sVar2]._content;
  uVar3 = uVar1 & 7;
  if (uVar3 == 2) {
    *(uint *)((long)(this->bindings)._array +
             (((this->super_BaseMatcher).op)->_content >> 1 & 0x3fffffffc)) = uVar1 >> 3 & 0x7ffffff
    ;
    (this->super_BaseMatcher).tp = sVar2 + 1;
  }
  return uVar3 == 2;
}

Assistant:

inline bool CodeTree::RemovingMatcher<checkRange>::doAssignVar()
{
  ASS_EQ(op->_instruction(), ASSIGN_VAR);

  //we are looking for variants and they match only other variables into variables
  unsigned var=op->_arg();
  const FlatTerm::Entry* fte=&(*ft)[tp];
  if(fte->_tag()!=FlatTerm::VAR) {
    return false;
  }
  bindings[var]=fte->_number();
  if constexpr (checkRange) {
    if (!range.insert(fte->_number())) {
      return false;
    }
  }
  tp++;
  return true;
}